

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void vkt::BindingModel::anon_unknown_1::ImageFetchRenderInstance::writeDescriptorSet
               (DeviceInterface *vki,VkDevice device,VkDescriptorType descriptorType,
               ShaderInputInterface shaderInterface,VkDescriptorSetLayout layout,
               VkDescriptorPool pool,VkImageView viewA,VkImageView viewB,
               VkDescriptorSet descriptorSet,DescriptorSetUpdateBuilder *updateBuilder,
               DescriptorUpdateMethod updateMethod)

{
  VkImageLayout layout_00;
  Location local_d8;
  VkDescriptorSet local_d0;
  Location local_c8;
  VkDescriptorSet local_c0;
  Location local_b8;
  VkDescriptorSet local_b0;
  Location local_a8;
  VkDescriptorSet local_a0;
  deUint64 local_98;
  deUint64 local_90;
  undefined1 local_88 [8];
  VkDescriptorImageInfo imageInfos [2];
  VkImageLayout imageLayout;
  ShaderInputInterface shaderInterface_local;
  VkDescriptorType descriptorType_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  VkDescriptorSet descriptorSet_local;
  VkImageView viewB_local;
  VkImageView viewA_local;
  VkDescriptorPool pool_local;
  VkDescriptorSetLayout layout_local;
  
  layout_00 = getImageLayoutForDescriptorType(descriptorType);
  local_90 = viewA.m_internal;
  makeDescriptorImageInfo((VkDescriptorImageInfo *)local_88,viewA,layout_00);
  local_98 = viewB.m_internal;
  makeDescriptorImageInfo((VkDescriptorImageInfo *)&imageInfos[0].imageLayout,viewB,layout_00);
  if (shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_a0.m_internal = descriptorSet.m_internal;
    local_a8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (updateBuilder,local_a0,&local_a8,descriptorType,(VkDescriptorImageInfo *)local_88);
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    local_b0.m_internal = descriptorSet.m_internal;
    local_b8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (updateBuilder,local_b0,&local_b8,descriptorType,(VkDescriptorImageInfo *)local_88);
    local_c0.m_internal = descriptorSet.m_internal;
    local_c8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (updateBuilder,local_c0,&local_c8,descriptorType,
               (VkDescriptorImageInfo *)&imageInfos[0].imageLayout);
  }
  else if (shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    local_d0.m_internal = descriptorSet.m_internal;
    local_d8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    ::vk::DescriptorSetUpdateBuilder::writeArray
              (updateBuilder,local_d0,&local_d8,descriptorType,2,(VkDescriptorImageInfo *)local_88);
  }
  if (updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    ::vk::DescriptorSetUpdateBuilder::update(updateBuilder,vki,device);
  }
  return;
}

Assistant:

void ImageFetchRenderInstance::writeDescriptorSet (const vk::DeviceInterface&		vki,
												   vk::VkDevice						device,
												   vk::VkDescriptorType				descriptorType,
												   ShaderInputInterface				shaderInterface,
												   vk::VkDescriptorSetLayout		layout,
												   vk::VkDescriptorPool				pool,
												   vk::VkImageView					viewA,
												   vk::VkImageView					viewB,
												   vk::VkDescriptorSet				descriptorSet,
												   vk::DescriptorSetUpdateBuilder&	updateBuilder,
												   DescriptorUpdateMethod			updateMethod)
{
	DE_UNREF(layout);
	DE_UNREF(pool);
	const vk::VkImageLayout									imageLayout			= getImageLayoutForDescriptorType(descriptorType);
	const vk::VkDescriptorImageInfo							imageInfos[2]		=
	{
		makeDescriptorImageInfo(viewA, imageLayout),
		makeDescriptorImageInfo(viewB, imageLayout),
	};

	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), descriptorType, &imageInfos[0]);
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), descriptorType, &imageInfos[0]);
			updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), descriptorType, &imageInfos[1]);
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateBuilder.writeArray(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), descriptorType, 2u, imageInfos);
			break;

		default:
			DE_FATAL("Impossible");
	}

	if (updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		updateBuilder.update(vki, device);
	}
}